

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::clearBufferuiv
          (ReferenceContext *this,deUint32 buffer,int drawbuffer,deUint32 *value)

{
  int iVar1;
  int width;
  bool bVar2;
  deBool dVar3;
  int iVar4;
  InternalError *this_00;
  bool *pbVar5;
  int *piVar6;
  ConstPixelBufferAccess *pCVar7;
  PixelBufferAccess *this_01;
  PixelBufferAccess *pPVar8;
  byte local_142;
  byte local_141;
  undefined1 local_12c [16];
  UVec4 local_11c;
  int local_10c;
  int local_108;
  int s;
  int x;
  int y;
  undefined1 local_f0 [8];
  UVec4 color;
  MultisamplePixelBufferAccess access;
  IVec4 local_8c;
  undefined1 local_7c [8];
  IVec4 area;
  bool maskZero;
  bool maskUsed;
  MultisamplePixelBufferAccess colorBuf;
  undefined1 local_30 [8];
  IVec4 baseArea;
  deUint32 *value_local;
  int drawbuffer_local;
  deUint32 buffer_local;
  ReferenceContext *this_local;
  
  baseArea.m_data._8_8_ = value;
  do {
    if (buffer != 0x1800) {
      setError(this,0x500);
      return;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  do {
    if (drawbuffer != 0) {
      setError(this,0x501);
      return;
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  if ((this->m_scissorEnabled & 1U) == 0) {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_30,0,0,0x7fffffff,0x7fffffff);
  }
  else {
    tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_30,&this->m_scissorBox);
  }
  do {
    dVar3 = ::deGetFalse();
    if (dVar3 != 0) {
      this_00 = (InternalError *)__cxa_allocate_exception(0x38);
      tcu::InternalError::InternalError
                (this_00,(char *)0x0,"buffer == GL_COLOR",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0xdc3);
      __cxa_throw(this_00,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  getDrawColorbuffer((MultisamplePixelBufferAccess *)(area.m_data + 3),this);
  pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
  local_141 = 1;
  if ((*pbVar5 & 1U) != 0) {
    pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
    local_141 = 1;
    if ((*pbVar5 & 1U) != 0) {
      pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
      local_141 = 1;
      if ((*pbVar5 & 1U) != 0) {
        pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
        local_141 = *pbVar5 ^ 0xff;
      }
    }
  }
  area.m_data[2]._3_1_ = local_141 & 1;
  pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,0);
  local_142 = 0;
  if ((*pbVar5 & 1U) == 0) {
    pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,1);
    local_142 = 0;
    if ((*pbVar5 & 1U) == 0) {
      pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,2);
      local_142 = 0;
      if ((*pbVar5 & 1U) == 0) {
        pbVar5 = tcu::Vector<bool,_4>::operator[](&this->m_colorMask,3);
        local_142 = *pbVar5 ^ 0xff;
      }
    }
  }
  area.m_data[2]._2_1_ = local_142 & 1;
  rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess
            ((MultisampleConstPixelBufferAccess *)
             &access.m_access.super_ConstPixelBufferAccess.m_data,
             (MultisamplePixelBufferAccess *)(area.m_data + 3));
  getBufferRect((sglr *)&local_8c,
                (MultisampleConstPixelBufferAccess *)
                &access.m_access.super_ConstPixelBufferAccess.m_data);
  intersect((sglr *)local_7c,(IVec4 *)local_30,&local_8c);
  bVar2 = isEmpty((IVec4 *)local_7c);
  if ((!bVar2) && ((area.m_data[2]._2_1_ & 1) == 0)) {
    piVar6 = tcu::Vector<int,_4>::x((Vector<int,_4> *)local_7c);
    iVar1 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::y((Vector<int,_4> *)local_7c);
    iVar4 = *piVar6;
    piVar6 = tcu::Vector<int,_4>::z((Vector<int,_4> *)local_7c);
    width = *piVar6;
    piVar6 = tcu::Vector<int,_4>::w((Vector<int,_4> *)local_7c);
    rr::getSubregion((MultisamplePixelBufferAccess *)(color.m_data + 2),
                     (MultisamplePixelBufferAccess *)(area.m_data + 3),iVar1,iVar4,width,*piVar6);
    tcu::Vector<unsigned_int,_4>::Vector
              ((Vector<unsigned_int,_4> *)local_f0,*(uint *)baseArea.m_data._8_8_,
               *(uint *)(baseArea.m_data._8_8_ + 4),*(uint *)(baseArea.m_data._8_8_ + 8),
               *(uint *)(baseArea.m_data._8_8_ + 0xc));
    if ((area.m_data[2]._3_1_ & 1) == 0) {
      tcu::Vector<unsigned_int,_4>::asInt((Vector<unsigned_int,_4> *)&x);
      rr::clear((MultisamplePixelBufferAccess *)(color.m_data + 2),(IVec4 *)&x);
    }
    else {
      s = 0;
      while( true ) {
        iVar1 = s;
        pCVar7 = &rr::MultisamplePixelBufferAccess::raw
                            ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                  super_ConstPixelBufferAccess;
        iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar7);
        if (iVar4 <= iVar1) break;
        local_108 = 0;
        while( true ) {
          iVar1 = local_108;
          pCVar7 = &rr::MultisamplePixelBufferAccess::raw
                              ((MultisamplePixelBufferAccess *)(color.m_data + 2))->
                    super_ConstPixelBufferAccess;
          iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar7);
          if (iVar4 <= iVar1) break;
          for (local_10c = 0; iVar1 = local_10c,
              iVar4 = rr::MultisamplePixelBufferAccess::getNumSamples
                                ((MultisamplePixelBufferAccess *)(color.m_data + 2)), iVar1 < iVar4;
              local_10c = local_10c + 1) {
            this_01 = rr::MultisamplePixelBufferAccess::raw
                                ((MultisamplePixelBufferAccess *)(color.m_data + 2));
            pPVar8 = rr::MultisamplePixelBufferAccess::raw
                               ((MultisamplePixelBufferAccess *)(color.m_data + 2));
            tcu::ConstPixelBufferAccess::getPixelUint
                      ((ConstPixelBufferAccess *)local_12c,(int)pPVar8,local_10c,local_108);
            tcu::select<unsigned_int,4>
                      ((tcu *)&local_11c,(Vector<unsigned_int,_4> *)local_f0,
                       (Vector<unsigned_int,_4> *)local_12c,&this->m_colorMask);
            tcu::PixelBufferAccess::setPixel(this_01,&local_11c,local_10c,local_108,s);
          }
          local_108 = local_108 + 1;
        }
        s = s + 1;
      }
    }
  }
  return;
}

Assistant:

void ReferenceContext::clearBufferuiv (deUint32 buffer, int drawbuffer, const deUint32* value)
{
	RC_IF_ERROR(buffer != GL_COLOR, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(drawbuffer != 0, GL_INVALID_VALUE, RC_RET_VOID); // \todo [2012-04-06 pyry] MRT support.

	IVec4 baseArea = m_scissorEnabled ? m_scissorBox : IVec4(0, 0, 0x7fffffff, 0x7fffffff);

	TCU_CHECK_INTERNAL(buffer == GL_COLOR);
	{
		rr::MultisamplePixelBufferAccess	colorBuf	= getDrawColorbuffer();
		bool								maskUsed	= !m_colorMask[0] || !m_colorMask[1] || !m_colorMask[2] || !m_colorMask[3];
		bool								maskZero	= !m_colorMask[0] && !m_colorMask[1] && !m_colorMask[2] && !m_colorMask[3];
		IVec4								area		= intersect(baseArea, getBufferRect(colorBuf));

		if (!isEmpty(area) && !maskZero)
		{
			rr::MultisamplePixelBufferAccess	access		= rr::getSubregion(colorBuf, area.x(), area.y(), area.z(), area.w());
			tcu::UVec4							color		(value[0], value[1], value[2], value[3]);

			if (!maskUsed)
				rr::clear(access, color.asInt());
			else
			{
				for (int y = 0; y < access.raw().getDepth(); y++)
					for (int x = 0; x < access.raw().getHeight(); x++)
						for (int s = 0; s < access.getNumSamples(); s++)
							access.raw().setPixel(tcu::select(color, access.raw().getPixelUint(s, x, y), m_colorMask), s, x, y);
			}
		}
	}
}